

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O1

Polynomial<double> __thiscall gmath::Polynomial<double>::operator-(Polynomial<double> *this)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  double *extraout_RDX;
  long in_RSI;
  long lVar4;
  Polynomial<double> PVar5;
  
  this->len = 0xc;
  this->used = 0;
  pdVar3 = (double *)operator_new__(0x60);
  this->c = pdVar3;
  this->used = 1;
  *pdVar3 = 0.0;
  increase(this,*(int *)(in_RSI + 4));
  iVar1 = *(int *)(in_RSI + 4);
  this->used = iVar1;
  pdVar3 = extraout_RDX;
  if (0 < (long)iVar1) {
    lVar2 = *(long *)(in_RSI + 8);
    pdVar3 = this->c;
    lVar4 = 0;
    do {
      pdVar3[lVar4] = -*(double *)(lVar2 + lVar4 * 8);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  PVar5.c = pdVar3;
  PVar5._0_8_ = this;
  return PVar5;
}

Assistant:

Polynomial<T> operator-() const
    {
      Polynomial<T> ret;

      ret.increase(used);
      ret.used=used;

      for (int i=0; i<used; i++)
      {
        ret.c[i]=-c[i];
      }

      return ret;
    }